

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

bool Infector::reduced_type_tests<GBVS>(void)

{
  return true;
}

Assistant:

bool reduced_type_tests(){

        //prevent service locator
        static_assert( !std::is_same<T,Infector::Container>::value
                      , "Cannot wire Infector::Container!");

        //prevent service locator
        static_assert( !std::is_base_of<Infector::Container,T>::value
                      , "Cannot wire Infector::Container or its subclasses!");

        static_assert(  std::is_destructible<T>::value
                      , " T must be destructible");

        return true;
    }